

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall network_pimpl::remove_event(network_pimpl *this,EventDataType *value)

{
  __type _Var1;
  ostream *poVar2;
  const_iterator __position;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __position._M_current =
       (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"---could not find event to delete. name: ");
      EventDataType::getName_abi_cxx11_(&local_90,value);
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      poVar2 = std::operator<<(poVar2," origin: ");
      EventDataType::getOrigin_abi_cxx11_(&local_b0,value);
      poVar2 = std::operator<<(poVar2,(string *)&local_b0);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      return;
    }
    EventDataType::getName_abi_cxx11_(&local_90,__position._M_current);
    EventDataType::getName_abi_cxx11_(&local_b0,value);
    _Var1 = std::operator==(&local_90,&local_b0);
    if (_Var1) {
      EventDataType::getOrigin_abi_cxx11_(&local_70,__position._M_current);
      EventDataType::getOrigin_abi_cxx11_(&local_50,value);
      _Var1 = std::operator==(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      if (_Var1) {
        std::vector<EventDataType,_std::allocator<EventDataType>_>::erase(&this->events,__position);
        return;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void network_pimpl::remove_event(const EventDataType &value){
    for(auto it = events.begin(); it != events.end(); ++it){
        if(it->getName() == value.getName() && it->getOrigin() == value.getOrigin()){
            events.erase(it);
            return;
        }
    }
    std::cerr << "---could not find event to delete. name: " << value.getName() << " origin: " << value.getOrigin() << "\n";
}